

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdTransform2d>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdTransform2d *transform,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __x;
  Property *prop;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  mapped_type *this;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  Property *pPVar6;
  string *psVar7;
  int iVar8;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
  *in_stack_fffffffffffffcc8;
  allocator local_329;
  string *local_328;
  ParseResult ret;
  string local_2f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2d0;
  string *local_2c8;
  string *local_2c0;
  string *local_2b8;
  string *local_2b0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_2a8;
  string *local_2a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ostringstream ss_e;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_328 = err;
  local_2c8 = warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&ss_e,"info:id",(allocator *)&ret);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  p_Var5 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_2a0 = (string *)&transform->in;
  local_2a8 = &transform->rotation;
  local_2b0 = (string *)&transform->scale;
  local_2b8 = (string *)&transform->translation;
  local_2c0 = (string *)&transform->result;
  local_2d0 = &(transform->super_ShaderNode).super_UsdShadePrim.props;
  for (p_Var4 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var5;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    __x = p_Var4 + 1;
    ::std::__cxx11::string::string(local_50,(string *)__x);
    prop = (Property *)(p_Var4 + 2);
    pPVar6 = (Property *)&ss_e;
    ::std::__cxx11::string::string((string *)pPVar6,"inputs:in",(allocator *)&local_2f0);
    (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
              (&ret,(_anonymous_namespace_ *)&table,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50,(string *)prop,pPVar6,local_2a0,in_stack_fffffffffffffcc8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar8 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar1 = false;
      iVar8 = 3;
    }
    else {
      bVar1 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReconstructShader");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1242);
        ::std::operator<<(poVar2," ");
        ::std::__cxx11::string::string
                  ((string *)&local_268,"Parsing attribute `{}` failed. Error: {}",&local_329);
        fmt::format<char[10],std::__cxx11::string>
                  (&local_2f0,(fmt *)&local_268,(string *)"inputs:in",(char (*) [10])&ret.err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
        poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2f0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar7 = local_328;
        if (local_328 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2f0,&local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar7);
          ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_2f0);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar1 = false;
        iVar8 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&local_70,(string *)__x);
      psVar7 = (string *)&ss_e;
      ::std::__cxx11::string::string((string *)psVar7,"inputs:rotation",(allocator *)&local_2f0);
      anon_unknown_0::ParseTypedAttribute<float>(&ret,&table,&local_70,prop,psVar7,local_2a8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar1 = false;
        iVar8 = 3;
      }
      else {
        bVar1 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructShader");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1244);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&local_268,"Parsing attribute `{}` failed. Error: {}",&local_329);
          fmt::format<char[16],std::__cxx11::string>
                    (&local_2f0,(fmt *)&local_268,(string *)"inputs:rotation",
                     (char (*) [16])&ret.err,psVar7);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2f0);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_328;
          if (local_328 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2f0,&local_268,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_2f0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
          iVar8 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) goto LAB_001d4e9e;
      ::std::__cxx11::string::string(local_90,(string *)__x);
      pPVar6 = (Property *)&ss_e;
      ::std::__cxx11::string::string((string *)pPVar6,"inputs:scale",(allocator *)&local_2f0);
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90,(string *)prop,pPVar6,local_2b0,in_stack_fffffffffffffcc8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar1 = false;
        iVar8 = 3;
      }
      else {
        bVar1 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructShader");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1246);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&local_268,"Parsing attribute `{}` failed. Error: {}",&local_329);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_2f0,(fmt *)&local_268,(string *)"inputs:scale",(char (*) [13])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2f0);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_328;
          if (local_328 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2f0,&local_268,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_2f0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
          iVar8 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) goto LAB_001d4e9e;
      ::std::__cxx11::string::string(local_b0,(string *)__x);
      pPVar6 = (Property *)&ss_e;
      ::std::__cxx11::string::string((string *)pPVar6,"inputs:translation",(allocator *)&local_2f0);
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0,(string *)prop,pPVar6,local_2b8,in_stack_fffffffffffffcc8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar1 = false;
        iVar8 = 3;
      }
      else {
        bVar1 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructShader");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1248);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&local_268,"Parsing attribute `{}` failed. Error: {}",&local_329);
          fmt::format<char[19],std::__cxx11::string>
                    (&local_2f0,(fmt *)&local_268,(string *)"inputs:translation",
                     (char (*) [19])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2f0);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_328;
          if (local_328 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2f0,&local_268,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_2f0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
          iVar8 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) goto LAB_001d4e9e;
      ::std::__cxx11::string::string(local_d0,(string *)__x);
      pPVar6 = (Property *)&ss_e;
      ::std::__cxx11::string::string((string *)pPVar6,"outputs:result",(allocator *)&local_2f0);
      (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0,(string *)prop,pPVar6,local_2c0,
                 (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffffcc8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar1 = false;
        iVar8 = 3;
      }
      else {
        bVar1 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructShader");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x124a);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&local_268,"Parsing shader output property `{}` failed. Error: {}",
                     &local_329);
          fmt::format<char[15],std::__cxx11::string>
                    (&local_2f0,(fmt *)&local_268,(string *)"outputs:result",(char (*) [15])&ret.err
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2f0);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_328;
          if (local_328 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2f0,&local_268,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_2f0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
          iVar8 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) goto LAB_001d4e9e;
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__x);
      if (sVar3 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](local_2d0,(key_type *)__x);
        Property::operator=(this,prop);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
      }
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__x);
      if (sVar3 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[warn]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReconstructShader");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x124c);
        ::std::operator<<(poVar2," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         "Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
        poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
        psVar7 = local_2c8;
        if (local_2c8 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_2f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328);
          ::std::__cxx11::string::operator=((string *)psVar7,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
    }
    else {
LAB_001d4e9e:
      if ((iVar8 != 3) && (iVar8 != 0)) break;
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return (_Rb_tree_header *)p_Var4 == p_Var5;
}

Assistant:

bool ReconstructShader<UsdTransform2d>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdTransform2d *transform,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("prop = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:in", UsdTransform2d,
                   transform->in)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:rotation", UsdTransform2d,
                   transform->rotation)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:scale", UsdTransform2d,
                   transform->scale)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:translation", UsdTransform2d,
                   transform->translation)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdTransform2d, transform->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, transform->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}